

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  VectorType VVar1;
  idx_t iVar2;
  
  if (sel == (SelectionVector *)0x0) {
    sel = FlatVector::IncrementalSelectionVector();
  }
  VVar1 = left->vector_type;
  if ((VVar1 == CONSTANT_VECTOR) && (right->vector_type == CONSTANT_VECTOR)) {
    iVar2 = SelectConstant<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals>
                      (left,right,sel,count,true_sel,false_sel);
    return iVar2;
  }
  if ((VVar1 == CONSTANT_VECTOR) && (right->vector_type == FLAT_VECTOR)) {
    iVar2 = SelectFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,true,false>
                      (left,right,sel,count,true_sel,false_sel);
    return iVar2;
  }
  if ((VVar1 == FLAT_VECTOR) && (right->vector_type == CONSTANT_VECTOR)) {
    iVar2 = SelectFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,true>
                      (left,right,sel,count,true_sel,false_sel);
    return iVar2;
  }
  if (VVar1 == FLAT_VECTOR && right->vector_type == FLAT_VECTOR) {
    iVar2 = SelectFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false>
                      (left,right,sel,count,true_sel,false_sel);
    return iVar2;
  }
  iVar2 = SelectGeneric<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals>
                    (left,right,sel,count,true_sel,false_sel);
  return iVar2;
}

Assistant:

static idx_t Select(Vector &left, Vector &right, const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
	                    SelectionVector *false_sel) {
		if (!sel) {
			sel = FlatVector::IncrementalSelectionVector();
		}
		if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectConstant<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, true, false>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, true>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, false>(left, right, sel, count, true_sel, false_sel);
#endif
		} else {
			return SelectGeneric<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
		}
	}